

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_StoCellIsDominated(Mio_Cell2_t *pCell,int *pFans,int *pProf)

{
  float fVar1;
  int iVar2;
  float fVar3;
  int local_2c;
  int k;
  int *pProf_local;
  int *pFans_local;
  Mio_Cell2_t *pCell_local;
  
  fVar1 = pCell->AreaF;
  fVar3 = Abc_Int2Float(*pProf);
  if (fVar3 <= fVar1 + 0.001) {
    for (local_2c = 0; local_2c < (int)(*(uint *)&pCell->field_0x10 >> 0x1c);
        local_2c = local_2c + 1) {
      iVar2 = Abc_Lit2Var(pFans[local_2c]);
      if (pCell->iDelays[iVar2] < pProf[local_2c + 1]) {
        return 0;
      }
    }
    pCell_local._4_4_ = 1;
  }
  else {
    pCell_local._4_4_ = 0;
  }
  return pCell_local._4_4_;
}

Assistant:

int Nf_StoCellIsDominated( Mio_Cell2_t * pCell, int * pFans, int * pProf )
{
    int k;
    if ( pCell->AreaF + NF_EPSILON < Abc_Int2Float(pProf[0]) )
        return 0;
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pCell->iDelays[Abc_Lit2Var(pFans[k])] < pProf[k+1] )
            return 0;
    return 1; // pCell is dominated
}